

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_hashtable_insert(arg_hashtable_t *h,void *k,void *v)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  arg_hashtable_entry **ppaVar4;
  arg_hashtable_entry **ppaVar5;
  arg_hashtable_entry *paVar6;
  ulong uVar7;
  arg_hashtable_entry **__ptr;
  double dVar8;
  
  if ((h->loadlimit < h->entrycount + 1) && (h->primeindex != 0x19)) {
    uVar2 = h->primeindex + 1;
    h->primeindex = uVar2;
    uVar2 = primes[uVar2];
    ppaVar4 = (arg_hashtable_entry **)calloc(1,(ulong)uVar2 * 8);
    if (ppaVar4 == (arg_hashtable_entry **)0x0) {
      (*s_panic)("Out of memory!\n");
    }
    uVar3 = h->tablelength;
    if ((ulong)uVar3 == 0) {
      __ptr = h->table;
    }
    else {
      __ptr = h->table;
      uVar7 = 0;
      do {
        paVar6 = __ptr[uVar7];
        if (paVar6 != (arg_hashtable_entry *)0x0) {
          ppaVar5 = __ptr + uVar7;
          do {
            *ppaVar5 = paVar6->next;
            uVar1 = (ulong)paVar6->h % (ulong)uVar2;
            paVar6->next = ppaVar4[uVar1];
            ppaVar4[uVar1] = paVar6;
            __ptr = h->table;
            ppaVar5 = __ptr + uVar7;
            paVar6 = *ppaVar5;
          } while (paVar6 != (arg_hashtable_entry *)0x0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
    free(__ptr);
    h->table = ppaVar4;
    h->tablelength = uVar2;
    dVar8 = ceil((double)uVar2 * 0.6499999761581421);
    h->loadlimit = (uint)(long)dVar8;
  }
  paVar6 = (arg_hashtable_entry *)malloc(0x20);
  if (paVar6 == (arg_hashtable_entry *)0x0) {
    (*s_panic)("Out of memory!\n");
  }
  uVar3 = (*h->hashfn)(k);
  uVar3 = uVar3 + ~(uVar3 << 9);
  uVar3 = uVar3 ^ (uVar3 * 0x40000 | uVar3 >> 0xe);
  uVar2 = uVar3 * 0x11;
  uVar2 = uVar2 ^ (uVar3 * 0x4400000 | uVar2 >> 10);
  paVar6->h = uVar2;
  uVar7 = (ulong)uVar2 % (ulong)h->tablelength;
  paVar6->k = k;
  paVar6->v = v;
  ppaVar4 = h->table;
  paVar6->next = ppaVar4[uVar7];
  ppaVar4[uVar7] = paVar6;
  h->entrycount = h->entrycount + 1;
  return;
}

Assistant:

void arg_hashtable_insert(arg_hashtable_t* h, void* k, void* v) {
    /* This method allows duplicate keys - but they shouldn't be used */
    unsigned int index;
    struct arg_hashtable_entry* e;
    if ((h->entrycount + 1) > h->loadlimit) {
        /*
         * Ignore the return value. If expand fails, we should
         * still try cramming just this value into the existing table
         * -- we may not have memory for a larger table, but one more
         * element may be ok. Next time we insert, we'll try expanding again.
         */
        arg_hashtable_expand(h);
    }
    e = (struct arg_hashtable_entry*)xmalloc(sizeof(struct arg_hashtable_entry));
    e->h = enhanced_hash(h, k);
    index = index_for(h->tablelength, e->h);
    e->k = k;
    e->v = v;
    e->next = h->table[index];
    h->table[index] = e;
    h->entrycount++;
}